

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasExtensionFromFile
               (Message *msg,FileDescriptor *file,Options *options,bool *has_opt_codesize_extension)

{
  FieldDescriptor *this;
  pointer ppFVar1;
  bool bVar2;
  FileOptions_OptimizeMode FVar3;
  int iVar4;
  pointer ppFVar5;
  Descriptor *pDVar6;
  Message *pMVar7;
  Reflection *this_00;
  int i;
  int index;
  Metadata MVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar8 = Message::GetMetadata(msg);
  this_00 = MVar8.reflection;
  Reflection::ListFields
            (this_00,msg,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_48);
  ppFVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar5 = local_48._M_impl.super__Vector_impl_data._M_start; ppFVar5 != ppFVar1;
      ppFVar5 = ppFVar5 + 1) {
    this = *ppFVar5;
    pDVar6 = FieldDescriptor::message_type(this);
    if (pDVar6 != (Descriptor *)0x0) {
      if ((this->field_0x1 & 8) != 0) {
        pDVar6 = FieldDescriptor::message_type(this);
        if (pDVar6->file_ == file) break;
        if ((has_opt_codesize_extension != (bool *)0x0) &&
           (FVar3 = GetOptimizeFor(pDVar6->file_,options),
           FVar3 == FileOptions_OptimizeMode_CODE_SIZE)) {
          *has_opt_codesize_extension = true;
        }
      }
      bVar2 = FieldDescriptor::is_repeated(this);
      if (bVar2) {
        index = 0;
        while (iVar4 = Reflection::FieldSize(this_00,msg,this), index < iVar4) {
          pMVar7 = Reflection::GetRepeatedMessage(this_00,msg,this,index);
          bVar2 = HasExtensionFromFile(pMVar7,file,options,has_opt_codesize_extension);
          index = index + 1;
          if (bVar2) goto LAB_00afb8bf;
        }
      }
      else {
        pMVar7 = Reflection::GetMessage(this_00,msg,this,(MessageFactory *)0x0);
        bVar2 = HasExtensionFromFile(pMVar7,file,options,has_opt_codesize_extension);
        if (bVar2) break;
      }
    }
  }
LAB_00afb8bf:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return ppFVar5 != ppFVar1;
}

Assistant:

static bool HasExtensionFromFile(const Message& msg, const FileDescriptor* file,
                                 const Options& options,
                                 bool* has_opt_codesize_extension) {
  std::vector<const FieldDescriptor*> fields;
  auto reflection = msg.GetReflection();
  reflection->ListFields(msg, &fields);
  for (auto field : fields) {
    const auto* field_msg = field->message_type();
    if (field_msg == nullptr) {
      // It so happens that enums Is_Valid are still generated so enums work.
      // Only messages have potential problems.
      continue;
    }
    // If this option has an extension set AND that extension is defined in the
    // same file we have bootstrap problem.
    if (field->is_extension()) {
      const auto* msg_extension_file = field->message_type()->file();
      if (msg_extension_file == file) return true;
      if (has_opt_codesize_extension &&
          GetOptimizeFor(msg_extension_file, options) ==
              FileOptions::CODE_SIZE) {
        *has_opt_codesize_extension = true;
      }
    }
    // Recurse in this field to see if there is a problem in there
    if (field->is_repeated()) {
      for (int i = 0; i < reflection->FieldSize(msg, field); i++) {
        if (HasExtensionFromFile(reflection->GetRepeatedMessage(msg, field, i),
                                 file, options, has_opt_codesize_extension)) {
          return true;
        }
      }
    } else {
      if (HasExtensionFromFile(reflection->GetMessage(msg, field), file,
                               options, has_opt_codesize_extension)) {
        return true;
      }
    }
  }
  return false;
}